

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BufferStreambuf.hh
# Opt level: O2

pos_type __thiscall
avro::istreambuf::seekoff(istreambuf *this,off_type off,seekdir dir,openmode param_3)

{
  long lVar1;
  element_type *peVar2;
  _Elt_pointer pCVar3;
  _Elt_pointer pCVar4;
  _Map_pointer ppCVar5;
  ulong uVar6;
  long lVar7;
  long lVar8;
  pos_type pVar9;
  
  lVar1 = this->basePos_;
  lVar8 = *(long *)&this->field_0x8;
  uVar6 = (*(long *)&this->field_0x10 - lVar8) + lVar1;
  if (dir == _S_end) {
    off = off + ((this->buffer_).pimpl_.px)->size_;
  }
  else if (dir == _S_cur) {
    off = off + uVar6;
  }
  if (off != uVar6) {
    lVar7 = (*(long *)&this->field_0x18 - lVar8) + lVar1;
    if ((lVar7 < off) && ((long)((this->buffer_).pimpl_.px)->size_ < off)) {
      uVar6 = 0xffffffffffffffff;
    }
    else {
      if (lVar1 <= off) goto LAB_001ac61d;
      peVar2 = (this->buffer_).pimpl_.px;
      pCVar3 = *(_Elt_pointer *)
                ((long)&(peVar2->readChunks_).
                        super__Deque_base<avro::detail::Chunk,_std::allocator<avro::detail::Chunk>_>
                        ._M_impl.super__Deque_impl_data._M_start + 8);
      pCVar4 = *(_Elt_pointer *)
                ((long)&(peVar2->readChunks_).
                        super__Deque_base<avro::detail::Chunk,_std::allocator<avro::detail::Chunk>_>
                        ._M_impl.super__Deque_impl_data._M_start + 0x10);
      ppCVar5 = *(_Map_pointer *)
                 ((long)&(peVar2->readChunks_).
                         super__Deque_base<avro::detail::Chunk,_std::allocator<avro::detail::Chunk>_>
                         ._M_impl.super__Deque_impl_data._M_start + 0x18);
      (this->iter_).helper_.iter_._M_cur =
           (peVar2->readChunks_).
           super__Deque_base<avro::detail::Chunk,_std::allocator<avro::detail::Chunk>_>._M_impl.
           super__Deque_impl_data._M_start._M_cur;
      (this->iter_).helper_.iter_._M_first = pCVar3;
      (this->iter_).helper_.iter_._M_last = pCVar4;
      (this->iter_).helper_.iter_._M_node = ppCVar5;
      this->basePos_ = 0;
      setBuffer(this);
      lVar8 = *(long *)&this->field_0x8;
      lVar7 = *(long *)&this->field_0x18;
      while( true ) {
        lVar7 = lVar7 - lVar8;
LAB_001ac61d:
        if (off <= lVar7) break;
        underflow(this);
        lVar8 = *(long *)&this->field_0x8;
        lVar7 = this->basePos_ + *(long *)&this->field_0x18;
      }
      *(long *)&this->field_0x10 = lVar8 + (off - this->basePos_);
      uVar6 = off;
    }
  }
  pVar9._M_state.__count = 0;
  pVar9._M_state.__value = (anon_union_4_2_91654ee9_for___value)0x0;
  pVar9._M_off = uVar6;
  return pVar9;
}

Assistant:

virtual pos_type seekoff(off_type off, std::ios::seekdir dir, std::ios_base::openmode) {

        off_type curpos = basePos_ + (gptr() - eback()); 
        off_type newpos = off;

        if(dir == std::ios::cur) {
            newpos += curpos;
        }
        else if (dir == std::ios::end) {
            newpos += buffer_.size();
        }
        // short circuit for tell()  
        if(newpos == curpos) {
            return curpos;
        }

        off_type endpos = basePos_ + (egptr() - eback());

        // if the position is after our current buffer make
        // sure it's not past the end of the buffer
        if((newpos > endpos) && (newpos > static_cast<off_type>(buffer_.size()) )) {
            return pos_type(-1);
        }
        // if the new position is before our current iterator
        // reset the iterator to the beginning
        else if (newpos < basePos_) {
            iter_ = buffer_.begin();
            basePos_ = 0;
            setBuffer();
            endpos = (egptr() -eback());
        }

        // now if the new position is after the end of the buffer
        // increase the buffer until it is not
        while (newpos > endpos) {
            istreambuf::underflow();
            endpos = basePos_ + (egptr() - eback()); 
        }

        setg(eback(), eback() + (newpos - basePos_), egptr());
        return newpos;
    }